

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O2

int mbedtls_rsa_parse_pubkey(mbedtls_rsa_context *rsa,uchar *key,size_t keylen)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *end;
  uchar *p;
  size_t len;
  
  end = key + keylen;
  p = key;
  iVar1 = mbedtls_asn1_get_tag(&p,end,&len,0x30);
  if ((((iVar1 == 0) && (iVar3 = -0x4080, iVar1 = iVar3, end == p + len)) &&
      (iVar1 = mbedtls_asn1_get_tag(&p,end,&len,2), iVar1 == 0)) &&
     (iVar2 = mbedtls_rsa_import_raw
                        (rsa,p,len,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0),
     iVar1 = iVar3, iVar2 == 0)) {
    p = p + len;
    iVar1 = mbedtls_asn1_get_tag(&p,end,&len,2);
    if ((iVar1 == 0) &&
       (((p == (uchar *)0x0 || (iVar2 = mbedtls_mpi_read_binary(&rsa->E,p,len), iVar2 == 0x4080)) ||
        (iVar1 = iVar3, iVar2 == 0)))) {
      p = p + len;
      iVar2 = mbedtls_rsa_complete(rsa);
      iVar1 = iVar3;
      if (((iVar2 == 0) && (iVar2 = mbedtls_rsa_check_pubkey(rsa), iVar2 == 0)) &&
         (iVar1 = -0x66, p == end)) {
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_parse_pubkey(mbedtls_rsa_context *rsa, const unsigned char *key, size_t keylen)
{
    unsigned char *p = (unsigned char *) key;
    unsigned char *end = (unsigned char *) (key + keylen);
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    /*
     *  RSAPublicKey ::= SEQUENCE {
     *      modulus           INTEGER,  -- n
     *      publicExponent    INTEGER   -- e
     *  }
     */

    if ((ret = mbedtls_asn1_get_tag(&p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return ret;
    }

    if (end != p + len) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    /* Import N */
    if ((ret = mbedtls_asn1_get_tag(&p, end, &len, MBEDTLS_ASN1_INTEGER)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_rsa_import_raw(rsa, p, len, NULL, 0, NULL, 0,
                                      NULL, 0, NULL, 0)) != 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    p += len;

    /* Import E */
    if ((ret = mbedtls_asn1_get_tag(&p, end, &len, MBEDTLS_ASN1_INTEGER)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_rsa_import_raw(rsa, NULL, 0, NULL, 0, NULL, 0,
                                      NULL, 0, p, len)) != 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    p += len;

    if (mbedtls_rsa_complete(rsa) != 0 ||
        mbedtls_rsa_check_pubkey(rsa) != 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    if (p != end) {
        return MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

    return 0;
}